

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O0

void __thiscall
Kernel::InferenceStore::TPTPProofPrinter::printSplitting(TPTPProofPrinter *this,Unit *us)

{
  bool bVar1;
  Inference *this_00;
  undefined7 extraout_var;
  ostream *poVar2;
  Unit *in_RSI;
  long in_RDI;
  InferenceRule in_stack_0000002f;
  string *in_stack_00000030;
  string *in_stack_00000038;
  string *in_stack_00000040;
  TPTPProofPrinter *in_stack_00000048;
  UnitInputType in_stack_00000060;
  Unit *comp;
  Unit *base;
  string inferenceStr;
  UnitIterator parents;
  InferenceRule rule;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  Unit *in_stack_fffffffffffffe68;
  undefined7 in_stack_fffffffffffffe80;
  InferenceRule in_stack_fffffffffffffe87;
  TPTPProofPrinter *in_stack_fffffffffffffe88;
  Unit *in_stack_fffffffffffffea0;
  TPTPProofPrinter *in_stack_fffffffffffffea8;
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  Unit *in_stack_ffffffffffffff20;
  TPTPProofPrinter *in_stack_ffffffffffffff28;
  string local_b8 [32];
  Unit *local_98;
  undefined8 local_88;
  string local_80 [32];
  string local_60 [32];
  string local_40 [47];
  InferenceRule local_11;
  
  this_00 = Unit::inference(in_RSI);
  local_11 = Inference::rule(this_00);
  Unit::getParents(in_stack_fffffffffffffe68);
  tptpRuleName_abi_cxx11_(in_stack_fffffffffffffe88,in_stack_fffffffffffffe87);
  std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::operator+(in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_80);
  bVar1 = Lib::VirtualIterator<Kernel::Unit_*>::hasNext((VirtualIterator<Kernel::Unit_*> *)0x86f5a4)
  ;
  local_88 = CONCAT71(extraout_var,bVar1);
  if (!bVar1) {
    Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator
              ((VirtualIterator<Kernel::Unit_*> *)in_stack_fffffffffffffe40);
    _Unwind_Resume(local_88);
  }
  local_98 = Lib::VirtualIterator<Kernel::Unit_*>::next((VirtualIterator<Kernel::Unit_*> *)0x86f63c)
  ;
  tptpUnitId_abi_cxx11_
            (in_stack_fffffffffffffe88,
             (Unit *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  std::__cxx11::string::operator+=(local_40,local_b8);
  std::__cxx11::string::~string(local_b8);
  while( true ) {
    bVar1 = Lib::VirtualIterator<Kernel::Unit_*>::hasNext
                      ((VirtualIterator<Kernel::Unit_*> *)0x86f69d);
    if (!bVar1) break;
    Lib::VirtualIterator<Kernel::Unit_*>::next((VirtualIterator<Kernel::Unit_*> *)0x86f6bd);
    tptpDefId_abi_cxx11_(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    std::operator+((char *)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
    std::__cxx11::string::operator+=(local_40,(string *)&stack0xffffffffffffff20);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff20);
    std::__cxx11::string::~string(local_100);
  }
  std::__cxx11::string::operator+=(local_40,"])");
  poVar2 = *(ostream **)(in_RDI + 0x78);
  tptpUnitId_abi_cxx11_
            (in_stack_fffffffffffffe88,
             (Unit *)CONCAT17(in_stack_fffffffffffffe87,in_stack_fffffffffffffe80));
  getFormulaString_abi_cxx11_(in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  std::__cxx11::string::string((string *)&stack0xfffffffffffffe80,local_40);
  getFofString(in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
               in_stack_0000002f,in_stack_00000060);
  poVar2 = std::operator<<(poVar2,local_120);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_120);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe80);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffea0);
  std::__cxx11::string::~string(local_140);
  std::__cxx11::string::~string(local_40);
  Lib::VirtualIterator<Kernel::Unit_*>::~VirtualIterator
            ((VirtualIterator<Kernel::Unit_*> *)in_stack_fffffffffffffe40);
  return;
}

Assistant:

void printSplitting(Unit* us)
  {
    ASS(us->isClause());

    InferenceRule rule = us->inference().rule();
    UnitIterator parents= us->getParents();
    ASS(rule==InferenceRule::GENERAL_SPLITTING);

    std::string inferenceStr="inference("+tptpRuleName(rule)+",[],[";

    //here we rely on the fact that the base premise is always put as the first premise in
    //GeneralSplitting::apply

    ALWAYS(parents.hasNext());
    Unit* base=parents.next();
    inferenceStr+=tptpUnitId(base);

    ASS(parents.hasNext()); //we always split off at least one component
    while(parents.hasNext()) {
      Unit* comp=parents.next();
      ASS(_is->_splittingNameLiterals.find(comp));
      inferenceStr+=","+tptpDefId(comp);
    }
    inferenceStr+="])";

    out<<getFofString(tptpUnitId(us), getFormulaString(us), inferenceStr, rule)<<endl;
  }